

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexWriterBase::writeReduction
          (PtexWriterBase *this,FILE *fp,void *data,int stride,Res res)

{
  ushort uVar1;
  int iVar2;
  ReduceFn *pRVar3;
  int iVar4;
  char ulog2_;
  char vlog2_;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  DataType DVar9;
  undefined1 **ppuVar10;
  undefined1 *local_a8;
  Res *in_stack_ffffffffffffff60;
  void *pvVar11;
  undefined1 *local_68;
  int dstride;
  char *buff;
  bool useNew;
  int buffsize;
  Res newres;
  void *pvStack_28;
  int stride_local;
  void *data_local;
  FILE *fp_local;
  PtexWriterBase *this_local;
  Res res_local;
  
  ppuVar10 = &local_a8;
  this_local._6_1_ = res.ulog2;
  ulog2_ = this_local._6_1_ + -1;
  this_local._7_1_ = res.vlog2;
  vlog2_ = this_local._7_1_ + -1;
  buffsize = stride;
  pvStack_28 = data;
  this_local._6_2_ = res;
  Res::Res((Res *)&stack0xffffffffffffffd2,ulog2_,vlog2_);
  iVar5 = Res::size(in_stack_ffffffffffffff60);
  iVar5 = iVar5 * this->_pixelSize;
  if (0x4000 < iVar5) {
    local_68 = (undefined1 *)operator_new__((long)iVar5);
  }
  else {
    ppuVar10 = (undefined1 **)((long)&local_a8 - ((long)iVar5 + 0xfU & 0xfffffffffffffff0));
    local_68 = (undefined1 *)ppuVar10;
  }
  *(undefined8 *)((long)ppuVar10 + -8) = 0x127327;
  iVar6 = Res::u((Res *)&stack0xffffffffffffffd2);
  iVar4 = buffsize;
  iVar2 = this->_pixelSize;
  pRVar3 = this->_reduceFn;
  pvVar11 = pvStack_28;
  *(undefined8 *)((long)ppuVar10 + -8) = 0x12735f;
  iVar7 = Res::u((Res *)((long)&this_local + 6));
  *(undefined8 *)((long)ppuVar10 + -8) = 0x12736e;
  iVar8 = Res::v((Res *)((long)&this_local + 6));
  *(undefined8 *)((long)ppuVar10 + -8) = 0x12738b;
  DVar9 = datatype(this);
  uVar1 = (this->_header).nchannels;
  *(DataType *)((long)ppuVar10 + -0x10) = DVar9;
  *(uint *)((long)ppuVar10 + -8) = (uint)uVar1;
  *(undefined8 *)((long)ppuVar10 + -0x18) = 0x1273ce;
  (*pRVar3)(pvVar11,iVar4,iVar7,iVar8,local_68,iVar6 * iVar2,*(DataType *)((long)ppuVar10 + -0x10),
            *(int *)((long)ppuVar10 + -8));
  *(undefined8 *)((long)ppuVar10 + -8) = 0x1273e6;
  writeBlock(*(PtexWriterBase **)((long)ppuVar10 + 0x60),*(FILE **)((long)ppuVar10 + 0x58),
             *(void **)((long)ppuVar10 + 0x50),*(int *)((long)ppuVar10 + 0x4c));
  if ((0x4000 < iVar5) && (local_a8 = local_68, local_68 != (undefined1 *)0x0)) {
    *(undefined8 *)((long)ppuVar10 + -8) = 0x127409;
    operator_delete__(local_68);
  }
  return;
}

Assistant:

void PtexWriterBase::writeReduction(FILE* fp, const void* data, int stride, Res res)
{
    // reduce and write to file
    Ptex::Res newres((int8_t)(res.ulog2-1), (int8_t)(res.vlog2-1));
    int buffsize = newres.size() * _pixelSize;
    bool useNew = buffsize > AllocaMax;
    char* buff = useNew ? new char [buffsize] : (char*)alloca(buffsize);

    int dstride = newres.u() * _pixelSize;
    _reduceFn(data, stride, res.u(), res.v(), buff, dstride, datatype(), _header.nchannels);
    writeBlock(fp, buff, buffsize);

    if (useNew) delete [] buff;
}